

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOptFields.cpp
# Opt level: O2

bool __thiscall GlobOpt::DoFieldPRE(GlobOpt *this,Loop *loop)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  JITTimeProfileInfo *this_00;
  
  uVar2 = Func::GetSourceContextId(this->func);
  uVar3 = Func::GetLocalFunctionId(this->func);
  bVar1 = Js::Phases::IsEnabled((Phases *)&DAT_01441eb0,FieldPREPhase,uVar2,uVar3);
  if (bVar1) {
    return false;
  }
  uVar2 = Func::GetSourceContextId(this->func);
  uVar3 = Func::GetLocalFunctionId(this->func);
  bVar1 = Js::Phases::IsEnabled((Phases *)&DAT_01436260,FieldPREPhase,uVar2,uVar3);
  if (!bVar1) {
    bVar1 = Func::HasProfileInfo(this->func);
    if (bVar1) {
      this_00 = Func::GetReadOnlyProfileInfo(this->func);
      bVar1 = JITTimeProfileInfo::IsFieldPREDisabled(this_00);
      if (bVar1) {
        return false;
      }
    }
    bVar1 = DoFieldOpts(this,loop);
    return bVar1;
  }
  return true;
}

Assistant:

bool
GlobOpt::DoFieldPRE(Loop *loop) const
{
    if (PHASE_OFF(Js::FieldPREPhase, this->func))
    {
        return false;
    }

    if (PHASE_FORCE(Js::FieldPREPhase, func))
    {
        // Force always turns on field PRE
        return true;
    }

    if (this->func->HasProfileInfo() && this->func->GetReadOnlyProfileInfo()->IsFieldPREDisabled())
    {
        return false;
    }

    return DoFieldOpts(loop);
}